

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XSObjectFactory.cpp
# Opt level: O3

void __thiscall
xercesc_4_0::XSObjectFactory::processFacets
          (XSObjectFactory *this,DatatypeValidator *dv,XSModel *xsModel,XSSimpleTypeDefinition *xsST
          )

{
  short *psVar1;
  XMLCh XVar2;
  XMLCh XVar3;
  FACET FVar4;
  MemoryManager *pMVar5;
  BaseRefVectorOf<xercesc_4_0::XSObject> *pBVar6;
  BaseRefVectorOf<xercesc_4_0::XSFacet> *this_00;
  BaseRefVectorOf<xercesc_4_0::XSMultiValueFacet> *this_01;
  bool bVar7;
  int iVar8;
  uint uVar9;
  FACET FVar10;
  XMLSize_t index;
  BaseRefVectorOf<xercesc_4_0::XSFacet> *this_02;
  undefined4 extraout_var;
  long lVar11;
  DatatypeValidator *pDVar12;
  BaseRefVectorOf<xercesc_4_0::XSMultiValueFacet> *this_03;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  XSMultiValueFacet *pXVar13;
  XSAnnotation *pXVar14;
  KVStringPair *key;
  XMLCh *pXVar15;
  BaseRefVectorOf<char16_t> *this_04;
  XMLCh *pXVar16;
  char16_t *__dest;
  XSFacet *pXVar17;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  byte bVar18;
  XMLCh *pXVar19;
  FACET facetKind;
  XMLSize_t XVar20;
  XSObjectFactory *this_05;
  RefHashTableOfEnumerator<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher> *this_06;
  ulong uVar21;
  size_t __n;
  FACET fixedFacets;
  RefHashTableOfEnumerator<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher> e;
  XMLStringTokenizer tokenizer;
  FACET local_104;
  FACET local_cc;
  RefHashTableOfEnumerator<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher> local_90;
  XMLStringTokenizer local_60;
  undefined4 extraout_var_02;
  
  uVar9 = dv->fFacetsDefined;
  FVar4 = dv->fFixed;
  this_02 = (BaseRefVectorOf<xercesc_4_0::XSFacet> *)
            XMemory::operator_new(0x30,this->fMemoryManager);
  pMVar5 = this->fMemoryManager;
  this_02->_vptr_BaseRefVectorOf = (_func_int **)&PTR__BaseRefVectorOf_004096f0;
  this_02->fAdoptedElems = false;
  this_02->fCurCount = 0;
  this_02->fMaxCount = 4;
  this_02->fElemList = (XSFacet **)0x0;
  this_02->fMemoryManager = pMVar5;
  iVar8 = (*pMVar5->_vptr_MemoryManager[3])(pMVar5,0x20);
  this_02->fElemList = (XSFacet **)CONCAT44(extraout_var,iVar8);
  lVar11 = 0;
  do {
    this_02->fElemList[lVar11] = (XSFacet *)0x0;
    lVar11 = lVar11 + 1;
  } while (lVar11 != 4);
  this_02->_vptr_BaseRefVectorOf = (_func_int **)&PTR__RefVectorOf_00409678;
  if (dv == (DatatypeValidator *)0x0) {
    this_03 = (BaseRefVectorOf<xercesc_4_0::XSMultiValueFacet> *)0x0;
  }
  else {
    this_03 = (BaseRefVectorOf<xercesc_4_0::XSMultiValueFacet> *)0x0;
    pDVar12 = dv;
    do {
      if ((pDVar12->fFacetsDefined & 0x18) != 0) {
        this_03 = (BaseRefVectorOf<xercesc_4_0::XSMultiValueFacet> *)
                  XMemory::operator_new(0x30,this->fMemoryManager);
        pMVar5 = this->fMemoryManager;
        this_03->_vptr_BaseRefVectorOf = (_func_int **)&PTR__BaseRefVectorOf_004097b0;
        this_03->fAdoptedElems = false;
        this_03->fCurCount = 0;
        this_03->fMaxCount = 2;
        this_03->fElemList = (XSMultiValueFacet **)0x0;
        this_03->fMemoryManager = pMVar5;
        iVar8 = (*pMVar5->_vptr_MemoryManager[3])(pMVar5,0x10);
        this_03->fElemList = (XSMultiValueFacet **)CONCAT44(extraout_var_00,iVar8);
        *(XSMultiValueFacet **)CONCAT44(extraout_var_00,iVar8) = (XSMultiValueFacet *)0x0;
        this_03->fElemList[1] = (XSMultiValueFacet *)0x0;
        this_03->_vptr_BaseRefVectorOf = (_func_int **)&PTR__RefVectorOf_00409738;
        break;
      }
      pDVar12 = pDVar12->fBaseValidator;
    } while (pDVar12 != (DatatypeValidator *)0x0);
  }
  fixedFacets = FACET_NONE;
  local_cc = FACET_NONE;
  local_104 = FACET_NONE;
  if ((uVar9 & 0x10) != 0) {
    iVar8 = (*(dv->super_XSerializable)._vptr_XSerializable[6])();
    this_05 = (XSObjectFactory *)0x40;
    pXVar13 = (XSMultiValueFacet *)XMemory::operator_new(0x40,this->fMemoryManager);
    pXVar14 = getAnnotationFromModel(this_05,xsModel,(StringList *)CONCAT44(extraout_var_01,iVar8));
    local_104 = (FVar4 & FACET_WHITESPACE) >> 4;
    XSMultiValueFacet::XSMultiValueFacet
              (pXVar13,FACET_ENUMERATION,(StringList *)CONCAT44(extraout_var_01,iVar8),
               SUB41(local_104,0),pXVar14,xsModel,this->fMemoryManager);
    fixedFacets = (FVar4 & FACET_WHITESPACE) << 7;
    pBVar6 = &this->fDeleteVector->super_BaseRefVectorOf<xercesc_4_0::XSObject>;
    BaseRefVectorOf<xercesc_4_0::XSObject>::ensureExtraCapacity(pBVar6,1);
    XVar20 = pBVar6->fCurCount;
    pBVar6->fElemList[XVar20] = (XSObject *)pXVar13;
    pBVar6->fCurCount = XVar20 + 1;
    BaseRefVectorOf<xercesc_4_0::XSMultiValueFacet>::ensureExtraCapacity(this_03,1);
    XVar20 = this_03->fCurCount;
    this_03->fElemList[XVar20] = pXVar13;
    this_03->fCurCount = XVar20 + 1;
    local_cc = FACET_ENUMERATION;
  }
  if (dv->fFacets == (RefHashTableOf<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher> *)0x0) {
    this_04 = (BaseRefVectorOf<char16_t> *)0x0;
  }
  else {
    RefHashTableOfEnumerator<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher>::
    RefHashTableOfEnumerator(&local_90,dv->fFacets,false,this->fMemoryManager);
    bVar18 = (byte)FVar4;
    this_04 = (BaseRefVectorOf<char16_t> *)0x0;
    while ((local_90.fCurElem != (RefHashTableBucketElem<xercesc_4_0::KVStringPair> *)0x0 ||
           (local_90.fCurHash != (local_90.fToEnum)->fHashModulus))) {
      this_06 = &local_90;
      key = RefHashTableOfEnumerator<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher>::
            nextElement(this_06);
      pXVar16 = key->fKey;
      pXVar14 = getAnnotationFromModel((XSObjectFactory *)this_06,xsModel,key);
      facetKind = FACET_MAXINCLUSIVE;
      if (pXVar16 == L"maxInclusive") {
LAB_002c726e:
        FVar10 = (uint)(bVar18 >> 5);
LAB_002c72a8:
        pXVar17 = (XSFacet *)XMemory::operator_new(0x40,this->fMemoryManager);
        local_104._0_1_ = (undefined1)FVar10;
        XSFacet::XSFacet(pXVar17,facetKind,key->fValue,(bool)((undefined1)local_104 & 1),pXVar14,
                         xsModel,this->fMemoryManager);
        pBVar6 = &this->fDeleteVector->super_BaseRefVectorOf<xercesc_4_0::XSObject>;
        BaseRefVectorOf<xercesc_4_0::XSObject>::ensureExtraCapacity(pBVar6,1);
        XVar20 = pBVar6->fCurCount;
        pBVar6->fElemList[XVar20] = (XSObject *)pXVar17;
        pBVar6->fCurCount = XVar20 + 1;
        BaseRefVectorOf<xercesc_4_0::XSFacet>::ensureExtraCapacity(this_02,1);
        XVar20 = this_02->fCurCount;
        this_02->fElemList[XVar20] = pXVar17;
        this_02->fCurCount = XVar20 + 1;
        local_cc = local_cc | facetKind;
        if ((FVar10 & FACET_LENGTH) == FACET_NONE) {
          facetKind = FACET_NONE;
        }
        fixedFacets = fixedFacets | facetKind;
        local_104 = FVar10;
      }
      else {
        pXVar15 = L"maxInclusive";
        if (pXVar16 == (XMLCh *)0x0) {
LAB_002c6ec3:
          if (*pXVar15 == L'\0') goto LAB_002c726e;
        }
        else {
          pXVar15 = L"maxInclusive";
          pXVar19 = pXVar16;
          do {
            XVar2 = *pXVar19;
            if (XVar2 == L'\0') goto LAB_002c6ec3;
            pXVar19 = pXVar19 + 1;
            XVar3 = *pXVar15;
            pXVar15 = pXVar15 + 1;
          } while (XVar2 == XVar3);
        }
        facetKind = FACET_MAXEXCLUSIVE;
        if (pXVar16 == L"maxExclusive") {
LAB_002c7274:
          FVar10 = (uint)(bVar18 >> 6);
          goto LAB_002c72a8;
        }
        pXVar15 = L"maxExclusive";
        if (pXVar16 == (XMLCh *)0x0) {
LAB_002c6f2d:
          if (*pXVar15 == L'\0') goto LAB_002c7274;
        }
        else {
          pXVar15 = L"maxExclusive";
          pXVar19 = pXVar16;
          do {
            XVar2 = *pXVar19;
            if (XVar2 == L'\0') goto LAB_002c6f2d;
            pXVar19 = pXVar19 + 1;
            XVar3 = *pXVar15;
            pXVar15 = pXVar15 + 1;
          } while (XVar2 == XVar3);
        }
        facetKind = FACET_MININCLUSIVE;
        if (pXVar16 == L"minInclusive") {
LAB_002c727a:
          FVar10 = (uint)(bVar18 >> 7);
          goto LAB_002c72a8;
        }
        pXVar15 = L"minInclusive";
        if (pXVar16 == (XMLCh *)0x0) {
LAB_002c6f6d:
          if (*pXVar15 == L'\0') goto LAB_002c727a;
        }
        else {
          pXVar15 = L"minInclusive";
          pXVar19 = pXVar16;
          do {
            XVar2 = *pXVar19;
            if (XVar2 == L'\0') goto LAB_002c6f6d;
            pXVar19 = pXVar19 + 1;
            XVar3 = *pXVar15;
            pXVar15 = pXVar15 + 1;
          } while (XVar2 == XVar3);
        }
        facetKind = FACET_MINEXCLUSIVE;
        FVar10 = FVar4 >> 8;
        if (pXVar16 == L"minExclusive") goto LAB_002c72a8;
        pXVar15 = L"minExclusive";
        if (pXVar16 == (XMLCh *)0x0) {
LAB_002c6fad:
          if (*pXVar15 == L'\0') goto LAB_002c72a8;
        }
        else {
          pXVar15 = L"minExclusive";
          pXVar19 = pXVar16;
          do {
            XVar2 = *pXVar19;
            if (XVar2 == L'\0') goto LAB_002c6fad;
            pXVar19 = pXVar19 + 1;
            XVar3 = *pXVar15;
            pXVar15 = pXVar15 + 1;
          } while (XVar2 == XVar3);
        }
        facetKind = FACET_LENGTH;
        FVar10 = FVar4;
        if (pXVar16 == L"length") goto LAB_002c72a8;
        pXVar15 = L"length";
        if (pXVar16 == (XMLCh *)0x0) {
LAB_002c6fed:
          if (*pXVar15 == L'\0') goto LAB_002c72a8;
        }
        else {
          pXVar15 = L"length";
          pXVar19 = pXVar16;
          do {
            XVar2 = *pXVar19;
            if (XVar2 == L'\0') goto LAB_002c6fed;
            pXVar19 = pXVar19 + 1;
            XVar3 = *pXVar15;
            pXVar15 = pXVar15 + 1;
          } while (XVar2 == XVar3);
        }
        facetKind = FACET_MINLENGTH;
        if (pXVar16 == L"minLength") {
LAB_002c728c:
          FVar10 = (uint)(bVar18 >> 1);
          goto LAB_002c72a8;
        }
        pXVar15 = L"minLength";
        if (pXVar16 == (XMLCh *)0x0) {
LAB_002c702d:
          if (*pXVar15 == L'\0') goto LAB_002c728c;
        }
        else {
          pXVar15 = L"minLength";
          pXVar19 = pXVar16;
          do {
            XVar2 = *pXVar19;
            if (XVar2 == L'\0') goto LAB_002c702d;
            pXVar19 = pXVar19 + 1;
            XVar3 = *pXVar15;
            pXVar15 = pXVar15 + 1;
          } while (XVar2 == XVar3);
        }
        facetKind = FACET_MAXLENGTH;
        if (pXVar16 == L"maxLength") {
LAB_002c7292:
          FVar10 = (uint)(bVar18 >> 2);
          goto LAB_002c72a8;
        }
        pXVar15 = L"maxLength";
        if (pXVar16 == (XMLCh *)0x0) {
LAB_002c7074:
          if (*pXVar15 == L'\0') goto LAB_002c7292;
        }
        else {
          pXVar15 = L"maxLength";
          pXVar19 = pXVar16;
          do {
            XVar2 = *pXVar19;
            if (XVar2 == L'\0') goto LAB_002c7074;
            pXVar19 = pXVar19 + 1;
            XVar3 = *pXVar15;
            pXVar15 = pXVar15 + 1;
          } while (XVar2 == XVar3);
        }
        facetKind = FACET_TOTALDIGITS;
        FVar10 = FVar4 >> 9;
        if (pXVar16 == L"totalDigits") goto LAB_002c72a8;
        pXVar15 = L"totalDigits";
        if (pXVar16 == (XMLCh *)0x0) {
LAB_002c70c2:
          if (*pXVar15 == L'\0') goto LAB_002c72a8;
        }
        else {
          pXVar15 = L"totalDigits";
          pXVar19 = pXVar16;
          do {
            XVar2 = *pXVar19;
            if (XVar2 == L'\0') goto LAB_002c70c2;
            pXVar19 = pXVar19 + 1;
            XVar3 = *pXVar15;
            pXVar15 = pXVar15 + 1;
          } while (XVar2 == XVar3);
        }
        facetKind = FACET_FRACTIONDIGITS;
        FVar10 = FVar4 >> 10;
        if (pXVar16 == L"fractionDigits") goto LAB_002c72a8;
        pXVar15 = L"fractionDigits";
        if (pXVar16 == (XMLCh *)0x0) {
LAB_002c7109:
          if (*pXVar15 == L'\0') goto LAB_002c72a8;
        }
        else {
          pXVar15 = L"fractionDigits";
          pXVar19 = pXVar16;
          do {
            XVar2 = *pXVar19;
            if (XVar2 == L'\0') goto LAB_002c7109;
            pXVar19 = pXVar19 + 1;
            XVar3 = *pXVar15;
            pXVar15 = pXVar15 + 1;
          } while (XVar2 == XVar3);
        }
        facetKind = FACET_WHITESPACE;
        FVar10 = FVar4 >> 0xe;
        if (pXVar16 == L"whiteSpace") goto LAB_002c72a8;
        pXVar15 = L"whiteSpace";
        if (pXVar16 == (XMLCh *)0x0) {
LAB_002c7149:
          if (*pXVar15 == L'\0') goto LAB_002c72a8;
        }
        else {
          pXVar15 = L"whiteSpace";
          pXVar19 = pXVar16;
          do {
            XVar2 = *pXVar19;
            if (XVar2 == L'\0') goto LAB_002c7149;
            pXVar19 = pXVar19 + 1;
            XVar3 = *pXVar15;
            pXVar15 = pXVar15 + 1;
          } while (XVar2 == XVar3);
        }
        bVar7 = XMLString::equals(pXVar16,L"pattern");
        if ((this_03 != (BaseRefVectorOf<xercesc_4_0::XSMultiValueFacet> *)0x0) && (bVar7)) {
          XMLStringTokenizer::XMLStringTokenizer
                    (&local_60,dv->fPattern,(XMLCh *)&regexSeparator,this->fMemoryManager);
          this_04 = (BaseRefVectorOf<char16_t> *)XMemory::operator_new(0x30,this->fMemoryManager);
          uVar9 = XMLStringTokenizer::countTokens(&local_60);
          BaseRefVectorOf<char16_t>::BaseRefVectorOf(this_04,(ulong)uVar9,true,this->fMemoryManager)
          ;
          this_04->_vptr_BaseRefVectorOf = (_func_int **)&PTR__RefArrayVectorOf_00401248;
          while (bVar7 = XMLStringTokenizer::hasMoreTokens(&local_60), bVar7) {
            pXVar16 = XMLStringTokenizer::nextToken(&local_60);
            if (pXVar16 == (XMLCh *)0x0) {
              __dest = (char16_t *)0x0;
            }
            else {
              __n = 0;
              do {
                psVar1 = (short *)((long)pXVar16 + __n);
                __n = __n + 2;
              } while (*psVar1 != 0);
              iVar8 = (*this->fMemoryManager->_vptr_MemoryManager[3])(this->fMemoryManager,__n);
              __dest = (char16_t *)CONCAT44(extraout_var_02,iVar8);
              memcpy(__dest,pXVar16,__n);
            }
            BaseRefVectorOf<char16_t>::ensureExtraCapacity(this_04,1);
            XVar20 = this_04->fCurCount;
            this_04->fElemList[XVar20] = __dest;
            this_04->fCurCount = XVar20 + 1;
          }
          local_104 = local_104 &
                      (FACET_MINEXCLUSIVE|FACET_MAXEXCLUSIVE|FACET_MAXINCLUSIVE|FACET_WHITESPACE|
                       FACET_PATTERN|FACET_MAXLENGTH|FACET_MINLENGTH|FACET_LENGTH);
          if ((FVar4 & FACET_PATTERN) != FACET_NONE) {
            local_104 = FACET_LENGTH;
          }
          pXVar13 = (XSMultiValueFacet *)XMemory::operator_new(0x40,this->fMemoryManager);
          XSMultiValueFacet::XSMultiValueFacet
                    (pXVar13,FACET_PATTERN,(StringList *)this_04,(bool)((undefined1)local_104 & 1),
                     pXVar14,xsModel,this->fMemoryManager);
          pBVar6 = &this->fDeleteVector->super_BaseRefVectorOf<xercesc_4_0::XSObject>;
          BaseRefVectorOf<xercesc_4_0::XSObject>::ensureExtraCapacity(pBVar6,1);
          XVar20 = pBVar6->fCurCount;
          pBVar6->fElemList[XVar20] = (XSObject *)pXVar13;
          pBVar6->fCurCount = XVar20 + 1;
          BaseRefVectorOf<xercesc_4_0::XSMultiValueFacet>::ensureExtraCapacity(this_03,1);
          fixedFacets = fixedFacets | FVar4 & FACET_PATTERN;
          XVar20 = this_03->fCurCount;
          this_03->fElemList[XVar20] = pXVar13;
          this_03->fCurCount = XVar20 + 1;
          local_cc = local_cc | FACET_PATTERN;
          XMLStringTokenizer::~XMLStringTokenizer(&local_60);
        }
      }
    }
    RefHashTableOfEnumerator<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher>::
    ~RefHashTableOfEnumerator(&local_90);
  }
  if ((local_cc & FACET_WHITESPACE) == FACET_NONE) {
    pXVar17 = (XSFacet *)XMemory::operator_new(0x40,this->fMemoryManager);
    pXVar16 = DatatypeValidator::getWSstring(dv,dv->fWhiteSpace);
    XSFacet::XSFacet(pXVar17,FACET_WHITESPACE,pXVar16,false,(XSAnnotation *)0x0,xsModel,
                     this->fMemoryManager);
    pBVar6 = &this->fDeleteVector->super_BaseRefVectorOf<xercesc_4_0::XSObject>;
    BaseRefVectorOf<xercesc_4_0::XSObject>::ensureExtraCapacity(pBVar6,1);
    XVar20 = pBVar6->fCurCount;
    pBVar6->fElemList[XVar20] = (XSObject *)pXVar17;
    pBVar6->fCurCount = XVar20 + 1;
    BaseRefVectorOf<xercesc_4_0::XSFacet>::ensureExtraCapacity(this_02,1);
    XVar20 = this_02->fCurCount;
    this_02->fElemList[XVar20] = pXVar17;
    this_02->fCurCount = XVar20 + 1;
    local_cc = local_cc | FACET_WHITESPACE;
  }
  iVar8 = (*(xsST->super_XSTypeDefinition).super_XSObject._vptr_XSObject[6])(xsST);
  if ((CONCAT44(extraout_var_03,iVar8) != 0) &&
     (iVar8 = (*(xsST->super_XSTypeDefinition).super_XSObject._vptr_XSObject[6])(xsST),
     *(int *)(CONCAT44(extraout_var_04,iVar8) + 0x28) == 0x10)) {
    iVar8 = (*(xsST->super_XSTypeDefinition).super_XSObject._vptr_XSObject[6])(xsST);
    this_00 = *(BaseRefVectorOf<xercesc_4_0::XSFacet> **)(CONCAT44(extraout_var_05,iVar8) + 0x50);
    if (this_00->fCurCount != 0) {
      XVar20 = 0;
      uVar21 = 1;
      do {
        pXVar17 = BaseRefVectorOf<xercesc_4_0::XSFacet>::elementAt(this_00,XVar20);
        if ((pXVar17->fFacetKind & local_cc) == FACET_NONE) {
          local_cc = pXVar17->fFacetKind | local_cc;
          BaseRefVectorOf<xercesc_4_0::XSFacet>::ensureExtraCapacity(this_02,1);
          XVar20 = this_02->fCurCount;
          this_02->fElemList[XVar20] = pXVar17;
          this_02->fCurCount = XVar20 + 1;
          if (pXVar17->fIsFixed == true) {
            fixedFacets = fixedFacets | pXVar17->fFacetKind;
          }
        }
        bVar7 = uVar21 < this_00->fCurCount;
        XVar20 = uVar21;
        uVar21 = (ulong)((int)uVar21 + 1);
      } while (bVar7);
    }
    if (((this_03 != (BaseRefVectorOf<xercesc_4_0::XSMultiValueFacet> *)0x0) &&
        (this_01 = *(BaseRefVectorOf<xercesc_4_0::XSMultiValueFacet> **)
                    (CONCAT44(extraout_var_05,iVar8) + 0x58),
        this_01 != (BaseRefVectorOf<xercesc_4_0::XSMultiValueFacet> *)0x0)) &&
       (this_01->fCurCount != 0)) {
      XVar20 = 0;
      uVar21 = 1;
      do {
        pXVar13 = BaseRefVectorOf<xercesc_4_0::XSMultiValueFacet>::elementAt(this_01,XVar20);
        if ((pXVar13->fFacetKind & local_cc) == FACET_NONE) {
          local_cc = pXVar13->fFacetKind | local_cc;
          BaseRefVectorOf<xercesc_4_0::XSMultiValueFacet>::ensureExtraCapacity(this_03,1);
          XVar20 = this_03->fCurCount;
          this_03->fElemList[XVar20] = pXVar13;
          this_03->fCurCount = XVar20 + 1;
          if (pXVar13->fIsFixed == true) {
            fixedFacets = fixedFacets | pXVar13->fFacetKind;
          }
        }
        bVar7 = uVar21 < this_01->fCurCount;
        XVar20 = uVar21;
        uVar21 = (ulong)((int)uVar21 + 1);
      } while (bVar7);
    }
  }
  XSSimpleTypeDefinition::setFacetInfo
            (xsST,local_cc,fixedFacets,(XSFacetList *)this_02,(XSMultiValueFacetList *)this_03,
             (StringList *)this_04);
  return;
}

Assistant:

void XSObjectFactory::processFacets(DatatypeValidator* const dv,
                                    XSModel* const xsModel,
                                    XSSimpleTypeDefinition* const xsST)
{
    // NOTE: XSMultiValueFacetList is not owned by XSModel!
    // NOTE: XSFacetList is not owned by XSModel!
    bool isFixed = false;
    int dvFacetsDefined = dv->getFacetsDefined();
    int dvFixedFacets = dv->getFixed();
    int definedFacets = 0;
    int fixedFacets = 0;
    XSMultiValueFacetList* xsMultiFacetList = 0;
    StringList* patternList = 0;
    XSFacetList* xsFacetList = new (fMemoryManager) RefVectorOf<XSFacet>(4, false, fMemoryManager);

    if (isMultiValueFacetDefined(dv))
        xsMultiFacetList = new (fMemoryManager) RefVectorOf<XSMultiValueFacet>(2, false, fMemoryManager);

    if (dvFacetsDefined & DatatypeValidator::FACET_ENUMERATION)
    {
        RefArrayVectorOf<XMLCh>* enumList = (RefArrayVectorOf<XMLCh>*) dv->getEnumString();

        if (dvFixedFacets & DatatypeValidator::FACET_ENUMERATION)
        {
            isFixed = true;
            fixedFacets |= XSSimpleTypeDefinition::FACET_ENUMERATION;
        }

        XSMultiValueFacet* mvFacet = new (fMemoryManager) XSMultiValueFacet(
            XSSimpleTypeDefinition::FACET_ENUMERATION , enumList, isFixed
            , getAnnotationFromModel(xsModel, enumList), xsModel, fMemoryManager
        );

        fDeleteVector->addElement(mvFacet);
        xsMultiFacetList->addElement(mvFacet);
        definedFacets |= XSSimpleTypeDefinition::FACET_ENUMERATION;
    }

    if (dv->getFacets())
    {
        RefHashTableOfEnumerator<KVStringPair> e(dv->getFacets(), false, fMemoryManager);
        while (e.hasMoreElements())
        {
            KVStringPair& pair = e.nextElement();
            XMLCh* key = pair.getKey();
            XSSimpleTypeDefinition::FACET facetType;
            XSAnnotation* annot = getAnnotationFromModel(xsModel, &pair);

            if (XMLString::equals(key, SchemaSymbols::fgELT_MAXINCLUSIVE))
            {
                facetType = XSSimpleTypeDefinition::FACET_MAXINCLUSIVE;
                isFixed = ((dvFixedFacets & DatatypeValidator::FACET_MAXINCLUSIVE) != 0);
            }
            else if (XMLString::equals(key, SchemaSymbols::fgELT_MAXEXCLUSIVE))
            {
                facetType = XSSimpleTypeDefinition::FACET_MAXEXCLUSIVE;
                isFixed = ((dvFixedFacets & DatatypeValidator::FACET_MAXEXCLUSIVE) !=0);
            }
            else if (XMLString::equals(key, SchemaSymbols::fgELT_MININCLUSIVE))
            {
                facetType = XSSimpleTypeDefinition::FACET_MININCLUSIVE;
                isFixed = ((dvFixedFacets & DatatypeValidator::FACET_MININCLUSIVE) !=0);
            }
            else if (XMLString::equals(key, SchemaSymbols::fgELT_MINEXCLUSIVE))
            {
                facetType = XSSimpleTypeDefinition::FACET_MINEXCLUSIVE;
                isFixed = ((dvFixedFacets & DatatypeValidator::FACET_MINEXCLUSIVE) != 0);
            }
            else if (XMLString::equals(key, SchemaSymbols::fgELT_LENGTH))
            {
                facetType = XSSimpleTypeDefinition::FACET_LENGTH;
                isFixed = ((dvFixedFacets & DatatypeValidator::FACET_LENGTH) != 0);
            }
            else if (XMLString::equals(key, SchemaSymbols::fgELT_MINLENGTH))
            {
                facetType = XSSimpleTypeDefinition::FACET_MINLENGTH;
                isFixed = ((dvFixedFacets & DatatypeValidator::FACET_MINLENGTH) != 0);
            }
            else if (XMLString::equals(key, SchemaSymbols::fgELT_MAXLENGTH))
            {
                facetType = XSSimpleTypeDefinition::FACET_MAXLENGTH;
                isFixed = ((dvFixedFacets & DatatypeValidator::FACET_MAXLENGTH) != 0);
            }
            else if (XMLString::equals(key, SchemaSymbols::fgELT_TOTALDIGITS))
            {
                facetType = XSSimpleTypeDefinition::FACET_TOTALDIGITS;
                isFixed = ((dvFixedFacets & DatatypeValidator::FACET_TOTALDIGITS) != 0);
            }
            else if (XMLString::equals(key, SchemaSymbols::fgELT_FRACTIONDIGITS))
            {
                facetType = XSSimpleTypeDefinition::FACET_FRACTIONDIGITS;
                isFixed = ((dvFixedFacets & DatatypeValidator::FACET_FRACTIONDIGITS) != 0);
            }
            else if (XMLString::equals(key, SchemaSymbols::fgELT_WHITESPACE))
            {
                facetType = XSSimpleTypeDefinition::FACET_WHITESPACE;
                isFixed = ((dvFixedFacets & DatatypeValidator::FACET_WHITESPACE) != 0);
            }
            else if (XMLString::equals(key, SchemaSymbols::fgELT_PATTERN) && xsMultiFacetList)
            {
                XMLStringTokenizer tokenizer(dv->getPattern(), regexSeparator, fMemoryManager);
                patternList = new (fMemoryManager) RefArrayVectorOf<XMLCh>(
                    tokenizer.countTokens(), true, fMemoryManager
                );

                while (tokenizer.hasMoreTokens())
                    patternList->addElement(XMLString::replicate(tokenizer.nextToken(), fMemoryManager));

                if (dvFixedFacets & DatatypeValidator::FACET_PATTERN)
                {
                    isFixed = true;
                    fixedFacets |= XSSimpleTypeDefinition::FACET_PATTERN;
                }

                XSMultiValueFacet* mvFacet = new (fMemoryManager) XSMultiValueFacet(
                    XSSimpleTypeDefinition::FACET_PATTERN, patternList
                    , isFixed, annot, xsModel, fMemoryManager
                );
                fDeleteVector->addElement(mvFacet);
                xsMultiFacetList->addElement(mvFacet);
                definedFacets |= XSSimpleTypeDefinition::FACET_PATTERN;
                continue;
            }
            else
            {
                // REVISIT: hmm... what about XSSimpleTypeDefinition::FACET_NONE
                // don't think I need to create an empty Facet?
                continue;
            }

            XSFacet* xsFacet = new (fMemoryManager) XSFacet(
                facetType, pair.getValue(), isFixed, annot, xsModel, fMemoryManager);

            fDeleteVector->addElement(xsFacet);
            xsFacetList->addElement(xsFacet);
            definedFacets |= facetType;
            if (isFixed)
                fixedFacets |= facetType;
        }
    }

    // add whistespace facet if missing
    if ((definedFacets & XSSimpleTypeDefinition::FACET_WHITESPACE) == 0)
    {
        XSFacet* xsFacet = new (fMemoryManager) XSFacet(
            XSSimpleTypeDefinition::FACET_WHITESPACE
            , dv->getWSstring(dv->getWSFacet())
            , false, 0, xsModel, fMemoryManager);

        fDeleteVector->addElement(xsFacet);
        xsFacetList->addElement(xsFacet);
        definedFacets |= XSSimpleTypeDefinition::FACET_WHITESPACE;
    }

    // inherit facets from base

    if (xsST->getBaseType() && xsST->getBaseType()->getTypeCategory() == XSTypeDefinition::SIMPLE_TYPE)
    {
        XSSimpleTypeDefinition* baseST = (XSSimpleTypeDefinition*) xsST->getBaseType();
        XSFacetList* baseFacets = baseST->getFacets();

        for (unsigned int i=0; i<baseFacets->size(); i++)
        {
            XSFacet* bFacet = baseFacets->elementAt(i);
            if ((definedFacets & bFacet->getFacetKind()) == 0)
            {
                definedFacets |= bFacet->getFacetKind();
                xsFacetList->addElement(bFacet);
                if (bFacet->isFixed())
                    fixedFacets |= bFacet->getFacetKind();
            }
        }

        if (baseST->getMultiValueFacets() && xsMultiFacetList)
        {
            XSMultiValueFacetList* baseMVFacets = baseST->getMultiValueFacets();
            for (unsigned int j=0; j<baseMVFacets->size(); j++)
            {
                XSMultiValueFacet* bFacet = baseMVFacets->elementAt(j);
                if ((definedFacets & bFacet->getFacetKind()) == 0)
                {
                    definedFacets |= bFacet->getFacetKind();
                    xsMultiFacetList->addElement(bFacet);
                    if (bFacet->isFixed())
                        fixedFacets |= bFacet->getFacetKind();
                }
            }
        }
    }

    xsST->setFacetInfo(definedFacets, fixedFacets, xsFacetList, xsMultiFacetList, patternList);
}